

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall
QGraphicsItemEffectSourcePrivate::boundingRect
          (QGraphicsItemEffectSourcePrivate *this,CoordinateSystem system)

{
  bool bVar1;
  int in_EDX;
  QMessageLogger *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  bool deviceCoordinates;
  char *in_stack_ffffffffffffff68;
  QRectF *pQVar2;
  undefined3 in_stack_ffffffffffffff88;
  uint uVar3;
  qreal local_68;
  qreal local_60;
  qreal local_58;
  qreal local_50;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(in_EDX == 0,in_stack_ffffffffffffff88);
  pQVar2 = in_RDI;
  if ((in_RSI[4].context.category == (char *)0x0) && (in_EDX == 0)) {
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)in_RDI,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff68);
    QMessageLogger::warning
              (local_28,
               "QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
    QRectF::QRectF(in_RDI);
  }
  else {
    in_RDI->xp = -NAN;
    in_RDI->yp = -NAN;
    in_RDI->w = -NAN;
    in_RDI->h = -NAN;
    (**(code **)(*(long *)in_RSI[4].context.function + 0x18))();
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RSI[4].context.function + 8));
    bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x98f4d4);
    if (!bVar1) {
      QGraphicsItem::childrenBoundingRect((QGraphicsItem *)CONCAT44(in_EDX,uVar3));
      QRectF::operator|=(pQVar2,in_RDI);
    }
    if ((uVar3 & 0x1000000) != 0) {
      QPainter::worldTransform();
      QTransform::mapRect((QRectF *)&local_68);
      in_RDI->xp = local_68;
      in_RDI->yp = local_60;
      in_RDI->w = local_58;
      in_RDI->h = local_50;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar2;
}

Assistant:

QRectF QGraphicsItemEffectSourcePrivate::boundingRect(Qt::CoordinateSystem system) const
{
    const bool deviceCoordinates = (system == Qt::DeviceCoordinates);
    if (!info && deviceCoordinates) {
        // Device coordinates without info not yet supported.
        qWarning("QGraphicsEffectSource::boundingRect: Not yet implemented, lacking device context");
        return QRectF();
    }

    QRectF rect = item->boundingRect();
    if (!item->d_ptr->children.isEmpty())
        rect |= item->childrenBoundingRect();

    if (deviceCoordinates) {
        Q_ASSERT(info->painter);
        rect = info->painter->worldTransform().mapRect(rect);
    }

    return rect;
}